

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.cpp
# Opt level: O2

bool __thiscall Sock::Wait(Sock *this,milliseconds timeout,Event requested,Event *occurred)

{
  int iVar1;
  long in_FS_OFFSET;
  undefined1 local_c3;
  undefined1 local_c2;
  undefined1 local_c1;
  EventsPerSock events_per_sock;
  __shared_ptr<const_Sock,_(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<const_Sock,_(__gnu_cxx::_Lock_policy)2> local_78;
  ushort local_68;
  __allocator_type __a2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  ushort local_48;
  undefined1 local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88._M_ptr = this;
  local_88._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  events_per_sock._M_h._M_buckets = (__buckets_ptr)&__a2;
  (local_88._M_refcount._M_pi)->_M_use_count = 1;
  (local_88._M_refcount._M_pi)->_M_weak_count = 1;
  (local_88._M_refcount._M_pi)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_base_00a2b140;
  local_88._M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)this;
  events_per_sock._M_h._M_bucket_count = 0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<const_Sock_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/sock.cpp:144:46),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_deleter<const_Sock_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_util_sock_cpp:144:46),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&events_per_sock);
  std::__shared_ptr<const_Sock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_78,&local_88);
  local_68 = (ushort)requested;
  ___a2 = local_78._M_ptr;
  _Stack_50._M_pi = local_78._M_refcount._M_pi;
  local_78._M_ptr = (element_type *)0x0;
  local_78._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48 = local_68;
  std::
  _Hashtable<std::shared_ptr<Sock_const>,std::pair<std::shared_ptr<Sock_const>const,Sock::Events>,std::allocator<std::pair<std::shared_ptr<Sock_const>const,Sock::Events>>,std::__detail::_Select1st,Sock::EqualSharedPtrSock,Sock::HashSharedPtrSock,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::shared_ptr<Sock_const>const,Sock::Events>const*>
            ((_Hashtable<std::shared_ptr<Sock_const>,std::pair<std::shared_ptr<Sock_const>const,Sock::Events>,std::allocator<std::pair<std::shared_ptr<Sock_const>const,Sock::Events>>,std::__detail::_Select1st,Sock::EqualSharedPtrSock,Sock::HashSharedPtrSock,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&events_per_sock,&__a2,local_40,0,&local_c1,&local_c2,&local_c3);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  iVar1 = (*this->_vptr_Sock[0xf])(this,timeout.__r,&events_per_sock);
  if ((occurred != (Event *)0x0 & SUB41(iVar1,0)) != 0) {
    *occurred = *(Event *)((long)&events_per_sock._M_h._M_before_begin._M_nxt[3]._M_nxt + 1);
  }
  std::
  _Hashtable<std::shared_ptr<const_Sock>,_std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>,_std::__detail::_Select1st,_Sock::EqualSharedPtrSock,_Sock::HashSharedPtrSock,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&events_per_sock._M_h);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return SUB41(iVar1,0);
  }
  __stack_chk_fail();
}

Assistant:

bool Sock::Wait(std::chrono::milliseconds timeout, Event requested, Event* occurred) const
{
    // We need a `shared_ptr` owning `this` for `WaitMany()`, but don't want
    // `this` to be destroyed when the `shared_ptr` goes out of scope at the
    // end of this function. Create it with a custom noop deleter.
    std::shared_ptr<const Sock> shared{this, [](const Sock*) {}};

    EventsPerSock events_per_sock{std::make_pair(shared, Events{requested})};

    if (!WaitMany(timeout, events_per_sock)) {
        return false;
    }

    if (occurred != nullptr) {
        *occurred = events_per_sock.begin()->second.occurred;
    }

    return true;
}